

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

void initAliasData(UErrorCode *errCode)

{
  UBool UVar1;
  uint uVar2;
  UDataMemory *pData;
  uint *puVar3;
  uint16_t *local_38;
  uint32_t currOffset;
  uint32_t tableStart;
  uint32_t *sectionSizes;
  uint16_t *table;
  UDataMemory *data;
  UErrorCode *errCode_local;
  
  ucln_common_registerCleanup_63(UCLN_COMMON_UCNV_IO,ucnv_io_cleanup);
  pData = udata_openChoice_63((char *)0x0,"icu","cnvalias",isAcceptable,(void *)0x0,errCode);
  UVar1 = U_FAILURE(*errCode);
  if (UVar1 == '\0') {
    puVar3 = (uint *)udata_getMemory_63(pData);
    uVar2 = *puVar3;
    if (uVar2 < 8) {
      *errCode = U_INVALID_FORMAT_ERROR;
      udata_close_63(pData);
    }
    else {
      gMainTable.converterListSize = puVar3[1];
      gMainTable.tagListSize = puVar3[2];
      gMainTable.aliasListSize = puVar3[3];
      gMainTable.untaggedConvArraySize = puVar3[4];
      gMainTable.taggedAliasArraySize = puVar3[5];
      gMainTable.taggedAliasListsSize = puVar3[6];
      gMainTable.optionTableSize = puVar3[7];
      gMainTable.stringTableSize = puVar3[8];
      if (8 < uVar2) {
        gMainTable.normalizedStringTableSize = puVar3[9];
      }
      uVar2 = uVar2 * 2 + 2;
      gMainTable.converterList = (uint16_t *)((long)puVar3 + (ulong)uVar2 * 2);
      uVar2 = gMainTable.converterListSize + uVar2;
      gMainTable.tagList = (uint16_t *)((long)puVar3 + (ulong)uVar2 * 2);
      uVar2 = gMainTable.tagListSize + uVar2;
      gMainTable.aliasList = (uint16_t *)((long)puVar3 + (ulong)uVar2 * 2);
      uVar2 = gMainTable.aliasListSize + uVar2;
      gMainTable.untaggedConvArray = (uint16_t *)((long)puVar3 + (ulong)uVar2 * 2);
      uVar2 = gMainTable.untaggedConvArraySize + uVar2;
      gMainTable.taggedAliasArray = (uint16_t *)((long)puVar3 + (ulong)uVar2 * 2);
      uVar2 = gMainTable.taggedAliasArraySize + uVar2;
      gMainTable.taggedAliasLists = (uint16_t *)((long)puVar3 + (ulong)uVar2 * 2);
      uVar2 = gMainTable.taggedAliasListsSize + uVar2;
      if ((gMainTable.optionTableSize == 0) || (1 < *(ushort *)((long)puVar3 + (ulong)uVar2 * 2))) {
        gMainTable.optionTable = &defaultTableOptions;
      }
      else {
        gMainTable.optionTable = (UConverterAliasOptions *)((long)puVar3 + (ulong)uVar2 * 2);
      }
      gMainTable.stringTable =
           (uint16_t *)((long)puVar3 + (ulong)(gMainTable.optionTableSize + uVar2) * 2);
      local_38 = gMainTable.stringTable;
      if ((gMainTable.optionTable)->stringNormalizationType != 0) {
        local_38 = (uint16_t *)
                   ((long)puVar3 +
                   (ulong)(gMainTable.stringTableSize + gMainTable.optionTableSize + uVar2) * 2);
      }
      gMainTable.normalizedStringTable = local_38;
      gAliasData = pData;
    }
  }
  return;
}

Assistant:

static void U_CALLCONV initAliasData(UErrorCode &errCode) {
    UDataMemory *data;
    const uint16_t *table;
    const uint32_t *sectionSizes;
    uint32_t tableStart;
    uint32_t currOffset;

    ucln_common_registerCleanup(UCLN_COMMON_UCNV_IO, ucnv_io_cleanup);

    U_ASSERT(gAliasData == NULL);
    data = udata_openChoice(NULL, DATA_TYPE, DATA_NAME, isAcceptable, NULL, &errCode);
    if(U_FAILURE(errCode)) {
        return;
    }

    sectionSizes = (const uint32_t *)udata_getMemory(data);
    table = (const uint16_t *)sectionSizes;

    tableStart      = sectionSizes[0];
    if (tableStart < minTocLength) {
        errCode = U_INVALID_FORMAT_ERROR;
        udata_close(data);
        return;
    }
    gAliasData = data;

    gMainTable.converterListSize      = sectionSizes[1];
    gMainTable.tagListSize            = sectionSizes[2];
    gMainTable.aliasListSize          = sectionSizes[3];
    gMainTable.untaggedConvArraySize  = sectionSizes[4];
    gMainTable.taggedAliasArraySize   = sectionSizes[5];
    gMainTable.taggedAliasListsSize   = sectionSizes[6];
    gMainTable.optionTableSize        = sectionSizes[7];
    gMainTable.stringTableSize        = sectionSizes[8];

    if (tableStart > 8) {
        gMainTable.normalizedStringTableSize = sectionSizes[9];
    }

    currOffset = tableStart * (sizeof(uint32_t)/sizeof(uint16_t)) + (sizeof(uint32_t)/sizeof(uint16_t));
    gMainTable.converterList = table + currOffset;

    currOffset += gMainTable.converterListSize;
    gMainTable.tagList = table + currOffset;

    currOffset += gMainTable.tagListSize;
    gMainTable.aliasList = table + currOffset;

    currOffset += gMainTable.aliasListSize;
    gMainTable.untaggedConvArray = table + currOffset;

    currOffset += gMainTable.untaggedConvArraySize;
    gMainTable.taggedAliasArray = table + currOffset;

    /* aliasLists is a 1's based array, but it has a padding character */
    currOffset += gMainTable.taggedAliasArraySize;
    gMainTable.taggedAliasLists = table + currOffset;

    currOffset += gMainTable.taggedAliasListsSize;
    if (gMainTable.optionTableSize > 0
        && ((const UConverterAliasOptions *)(table + currOffset))->stringNormalizationType < UCNV_IO_NORM_TYPE_COUNT)
    {
        /* Faster table */
        gMainTable.optionTable = (const UConverterAliasOptions *)(table + currOffset);
    }
    else {
        /* Smaller table, or I can't handle this normalization mode!
        Use the original slower table lookup. */
        gMainTable.optionTable = &defaultTableOptions;
    }

    currOffset += gMainTable.optionTableSize;
    gMainTable.stringTable = table + currOffset;

    currOffset += gMainTable.stringTableSize;
    gMainTable.normalizedStringTable = ((gMainTable.optionTable->stringNormalizationType == UCNV_IO_UNNORMALIZED)
        ? gMainTable.stringTable : (table + currOffset));
}